

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

void __thiscall QTableModel::clearContents(QTableModel *this)

{
  QTableWidgetItem **ppQVar1;
  QTableWidgetItem *pQVar2;
  pointer ppQVar3;
  ulong uVar4;
  ulong uVar5;
  
  QAbstractItemModel::beginResetModel();
  uVar4 = (this->tableItems).d.size;
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      ppQVar1 = (this->tableItems).d.ptr;
      pQVar2 = ppQVar1[uVar5];
      if (pQVar2 != (QTableWidgetItem *)0x0) {
        pQVar2->view = (QTableWidget *)0x0;
        pQVar2 = ppQVar1[uVar5];
        if (pQVar2 != (QTableWidgetItem *)0x0) {
          (*pQVar2->_vptr_QTableWidgetItem[1])();
        }
        ppQVar3 = QList<QTableWidgetItem_*>::data(&this->tableItems);
        ppQVar3[uVar5] = (QTableWidgetItem *)0x0;
        uVar4 = (this->tableItems).d.size;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
  }
  QAbstractItemModel::endResetModel();
  return;
}

Assistant:

void QTableModel::clearContents()
{
    beginResetModel();
    for (int i = 0; i < tableItems.size(); ++i) {
        if (tableItems.at(i)) {
            tableItems.at(i)->view = nullptr;
            delete tableItems.at(i);
            tableItems[i] = 0;
        }
    }
    endResetModel();
}